

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall Diligent::GLContextState::SetStencilRef(GLContextState *this,GLenum Face,Int32 Ref)

{
  StencilOpState *pSVar1;
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  GLenum err;
  GLenum GlStencilFunc;
  StencilOpState *FaceStencilOp;
  Int32 Ref_local;
  GLenum Face_local;
  GLContextState *this_local;
  
  pSVar1 = (this->m_DSState).m_StencilOpState + (int)(uint)(Face != 0x404);
  msg.field_2._12_4_ = CompareFuncToGLCompareFunc(pSVar1->Func);
  (*__glewStencilFuncSeparate)(Face,msg.field_2._12_4_,Ref,pSVar1->Mask);
  msg.field_2._8_4_ = glGetError();
  if (msg.field_2._8_4_ != 0) {
    LogError<false,char[31],char[17],unsigned_int>
              (false,"SetStencilRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x21b,(char (*) [31])"Failed to set stencil function",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
    FormatString<char[6]>((string *)local_48,(char (*) [6])0xe8e72e);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"SetStencilRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x21b);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void GLContextState::SetStencilRef(GLenum Face, Int32 Ref)
{
    DepthStencilGLState::StencilOpState& FaceStencilOp = m_DSState.m_StencilOpState[Face == GL_FRONT ? 0 : 1];
    GLenum                               GlStencilFunc = CompareFuncToGLCompareFunc(FaceStencilOp.Func);
    glStencilFuncSeparate(Face, GlStencilFunc, Ref, FaceStencilOp.Mask);
    DEV_CHECK_GL_ERROR("Failed to set stencil function");
}